

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,VariableNode *node)

{
  pointer pcVar1;
  Value *pVVar2;
  RuntimeSymbolVisitor RVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var4;
  Function *this_01;
  long *plVar5;
  int in_ECX;
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  *pdVar6;
  void *__child_stack;
  void *in_R8;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar7;
  TypeName returnType;
  RuntimeFunctionAnalyser functionAnalyser;
  string name;
  ArgumentsList args;
  RuntimeVariableAnalyser analyser;
  _Storage<TypeName,_true> local_324;
  shared_ptr<BlockNode> local_320;
  RuntimeFunctionAnalyser local_310;
  string local_2d0;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  local_2b0;
  RuntimeVariableAnalyser local_298;
  undefined1 local_260 [16];
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  local_250;
  deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
  local_200;
  ostringstream local_1b0 [112];
  ios_base local_140 [272];
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar1,pcVar1 + (node->name_)._M_string_length);
  oVar7 = Context::lookup(&this->context_,&local_2d0,0);
  _Var4 = oVar7.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>._M_payload;
  if (((undefined1  [16])
       oVar7.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> & (undefined1  [16])0x1)
      == (undefined1  [16])0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310,
                   "Dereferencing invalid symbol ",&local_2d0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_260._0_8_ = *plVar5;
    pdVar6 = (deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
              *)(plVar5 + 2);
    if ((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
         *)local_260._0_8_ == pdVar6) {
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (pdVar6->
           super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
           )._M_impl.super__Deque_impl_data._M_map;
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = plVar5[3];
      local_260._0_8_ = &local_250;
    }
    else {
      local_250.
      super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (pdVar6->
           super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
           )._M_impl.super__Deque_impl_data._M_map;
    }
    local_260._8_8_ = ((__uniq_ptr_impl<Value,_std::default_delete<Value>_> *)(plVar5 + 1))->_M_t;
    *plVar5 = (long)pdVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    reportError((string *)local_260,(Node *)node);
  }
  RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_298);
  (**(code **)(*(long *)_Var4 + 0x10))(_Var4,&local_298);
  if (local_298.symbolValid_ == true) {
    Executor((Executor *)local_260,
             (Context *)
             local_298.context_.
             super__Optional_base<std::reference_wrapper<const_Context>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<const_Context>_>._M_payload);
    (*((local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Node)._vptr_Node[2])
              (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_260);
    (**(code **)(*(long *)local_260._8_8_ + 0x10))(&local_310);
    RVar3._vptr_RuntimeSymbolVisitor =
         local_310.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor;
    local_310.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor = (_func_int **)0x0;
    pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = (Value *)RVar3._vptr_RuntimeSymbolVisitor;
    if (pVVar2 != (Value *)0x0) {
      (*pVVar2->_vptr_Value[1])();
      if (local_310.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor != (_func_int **)0x0) {
        (**(code **)(*local_310.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor + 8))();
      }
    }
    local_260._0_8_ = &PTR__Executor_00150380;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    std::ios_base::~ios_base(local_140);
    std::
    deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
    ::~deque(&local_200);
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque(&local_250);
    if ((__uniq_ptr_impl<Value,_std::default_delete<Value>_>)local_260._8_8_ !=
        (__uniq_ptr_impl<Value,_std::default_delete<Value>_>)0x0) {
      (**(code **)(*(long *)local_260._8_8_ + 8))();
    }
  }
  else {
    RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(&local_310);
    (**(code **)(*(long *)_Var4 + 0x10))(_Var4,&local_310);
    if (((ulong)local_310.returnType_.super__Optional_base<TypeName,_true,_true>._M_payload.
                super__Optional_payload_base<TypeName> >> 0x20 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    local_324._M_value =
         local_310.returnType_.super__Optional_base<TypeName,_true,_true>._M_payload.
         super__Optional_payload_base<TypeName>._M_payload;
    std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
            *)&local_2b0,&local_310.arguments_);
    this_00._M_pi =
         local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Context::clone((Context *)local_260,(__fn *)&this->context_,__child_stack,in_ECX,in_R8);
    this_01 = (Function *)operator_new(0x88);
    local_320.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_320.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
    }
    Function::Function(this_01,&local_324._M_value,(ArgumentsList *)&local_2b0,&local_320,
                       (Context *)local_260);
    if (local_320.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_320.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    pVVar2 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
             super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
             super__Head_base<0UL,_Value_*,_false>._M_head_impl;
    (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
    super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
    super__Head_base<0UL,_Value_*,_false>._M_head_impl = (Value *)this_01;
    if (pVVar2 != (Value *)0x0) {
      (*pVVar2->_vptr_Value[1])();
    }
    std::
    deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
    ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
              *)local_260);
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::_M_clear(&local_2b0);
    local_310.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor =
         (_func_int **)&PTR__RuntimeFunctionAnalyser_00150160;
    if (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_310.body_.super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
    ::_M_clear(&local_310.arguments_.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              );
  }
  local_298.super_RuntimeSymbolVisitor._vptr_RuntimeSymbolVisitor =
       (_func_int **)&PTR__RuntimeVariableAnalyser_00150130;
  if (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.value_.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Executor::visit(const VariableNode& node)
{
  const auto name = node.getName();
  const auto symbol = context_.lookup(name);

  if(!symbol)
    reportError("Dereferencing invalid symbol " + name + "!", node);

  RuntimeVariableAnalyser analyser{};
  symbol.value().get().accept(analyser);

  if(analyser.isSymbolValid())
  {
    const auto& value = analyser.getValue();
    auto executor = Executor{analyser.getContext()};

    value->accept(executor);
    value_ = executor.getValue()->clone();
  }
  else
  {
    RuntimeFunctionAnalyser functionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    const auto returnType = functionAnalyser.getReturnType().value();
    const auto args = functionAnalyser.getArguments();
    const auto body = functionAnalyser.getBody();

    value_ = std::make_unique<Function>(returnType, args, body, context_.clone());
  }
}